

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

lua_Number lua_tonumber(lua_State *L,int idx)

{
  TValue *obj;
  TValue n;
  TValue local_10;
  
  obj = index2adr(L,idx);
  if ((obj->tt != 3) && (obj = luaV_tonumber(obj,&local_10), obj == (TValue *)0x0)) {
    return 0.0;
  }
  return (lua_Number)(obj->value).gc;
}

Assistant:

LUA_API lua_Number lua_tonumber (lua_State *L, int idx) {
  TValue n;
  const TValue *o = index2adr(L, idx);
  if (tonumber(o, &n))
    return nvalue(o);
  else
    return 0;
}